

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5ConfigLoad(Fts5Config *pConfig,int iCookie)

{
  sqlite3_stmt *pStmt;
  int iVar1;
  char *zSql;
  uchar *zLeft;
  sqlite3_value *pMem;
  long in_FS_OFFSET;
  i64 local_50;
  int local_48;
  int local_44;
  sqlite3_stmt *p;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = (sqlite3_stmt *)0x0;
  local_44 = 0;
  pConfig->pgsz = 0xfd2;
  pConfig->nAutomerge = 4;
  pConfig->nCrisisMerge = 0x10;
  pConfig->nUsermerge = 4;
  pConfig->nHashSize = 0x100000;
  pConfig->nDeleteMerge = 10;
  zSql = sqlite3Fts5Mprintf(&local_44,"SELECT k, v FROM %Q.\'%q_config\'",pConfig->zDb,
                            pConfig->zName);
  iVar1 = local_44;
  if (zSql != (char *)0x0) {
    iVar1 = sqlite3_prepare_v2(pConfig->db,zSql,-1,&p,(char **)0x0);
    sqlite3_free(zSql);
  }
  pStmt = p;
  local_50 = 0;
  if (iVar1 == 0) {
    local_50 = 0;
    while (iVar1 = sqlite3_step(pStmt), iVar1 == 100) {
      zLeft = sqlite3_column_text(pStmt,0);
      pMem = sqlite3_column_value(pStmt,1);
      iVar1 = sqlite3_stricmp((char *)zLeft,"version");
      if (iVar1 == 0) {
        local_50 = sqlite3VdbeIntValue(pMem);
      }
      else {
        sqlite3Fts5ConfigSetValue(pConfig,(char *)zLeft,pMem,&local_48);
      }
    }
    iVar1 = sqlite3_finalize(pStmt);
  }
  if ((iVar1 == 0) && ((int)local_50 - 6U < 0xfffffffe)) {
    sqlite3Fts5ConfigErrmsg
              (pConfig,"invalid fts5 file format (found %d, expected %d or %d) - run \'rebuild\'",
               local_50,4,5);
    iVar1 = 1;
  }
  else {
    pConfig->iVersion = (int)local_50;
    if (iVar1 == 0) {
      pConfig->iCookie = iCookie;
      iVar1 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5ConfigLoad(Fts5Config *pConfig, int iCookie){
  const char *zSelect = "SELECT k, v FROM %Q.'%q_config'";
  char *zSql;
  sqlite3_stmt *p = 0;
  int rc = SQLITE_OK;
  int iVersion = 0;

  /* Set default values */
  pConfig->pgsz = FTS5_DEFAULT_PAGE_SIZE;
  pConfig->nAutomerge = FTS5_DEFAULT_AUTOMERGE;
  pConfig->nUsermerge = FTS5_DEFAULT_USERMERGE;
  pConfig->nCrisisMerge = FTS5_DEFAULT_CRISISMERGE;
  pConfig->nHashSize = FTS5_DEFAULT_HASHSIZE;
  pConfig->nDeleteMerge = FTS5_DEFAULT_DELETE_AUTOMERGE;

  zSql = sqlite3Fts5Mprintf(&rc, zSelect, pConfig->zDb, pConfig->zName);
  if( zSql ){
    rc = sqlite3_prepare_v2(pConfig->db, zSql, -1, &p, 0);
    sqlite3_free(zSql);
  }

  assert( rc==SQLITE_OK || p==0 );
  if( rc==SQLITE_OK ){
    while( SQLITE_ROW==sqlite3_step(p) ){
      const char *zK = (const char*)sqlite3_column_text(p, 0);
      sqlite3_value *pVal = sqlite3_column_value(p, 1);
      if( 0==sqlite3_stricmp(zK, "version") ){
        iVersion = sqlite3_value_int(pVal);
      }else{
        int bDummy = 0;
        sqlite3Fts5ConfigSetValue(pConfig, zK, pVal, &bDummy);
      }
    }
    rc = sqlite3_finalize(p);
  }

  if( rc==SQLITE_OK
   && iVersion!=FTS5_CURRENT_VERSION
   && iVersion!=FTS5_CURRENT_VERSION_SECUREDELETE
  ){
    rc = SQLITE_ERROR;
    sqlite3Fts5ConfigErrmsg(pConfig, "invalid fts5 file format "
        "(found %d, expected %d or %d) - run 'rebuild'",
        iVersion, FTS5_CURRENT_VERSION, FTS5_CURRENT_VERSION_SECUREDELETE
    );
  }else{
    pConfig->iVersion = iVersion;
  }

  if( rc==SQLITE_OK ){
    pConfig->iCookie = iCookie;
  }
  return rc;
}